

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

void take_line(Env *env)

{
  uint uVar1;
  _Bool _Var2;
  
  while( true ) {
    _Var2 = (*env->lexer->eof)(env->lexer);
    if ((_Var2) ||
       ((uVar1 = env->lexer->lookahead, uVar1 < 0xe && ((0x3400U >> (uVar1 & 0x1f) & 1) != 0))))
    break;
    advance(env);
  }
  return;
}

Assistant:

static void take_line(Env *env) {
  while (not_eof(env) && !is_newline(PEEK)) S_ADVANCE;
}